

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bellman_ford_test.cpp
# Opt level: O0

void benchmark(Graph *g,int times)

{
  allocator<unsigned_long> *this;
  size_type sVar1;
  short sVar2;
  ostream *poVar3;
  vertices_size_type __n;
  reference pvVar4;
  reference pvVar5;
  clock_t cVar6;
  long lVar7;
  int local_19c;
  int local_134;
  double elapsed_secs_rafa;
  int s_1;
  bool r_rafa;
  undefined1 local_e8 [8];
  vector<long,_std::allocator<long>_> dist;
  undefined1 local_c8 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> pred;
  double elapsed_secs_boost;
  clock_t end;
  pointer local_98;
  int local_8c;
  size_type sStack_88;
  int s;
  unsigned_long i_1;
  clock_t begin;
  undefined1 local_70 [6];
  bool r_boost;
  vector<unsigned_long,_std::allocator<unsigned_long>_> b_pred;
  allocator<int> local_45;
  int local_44;
  undefined1 local_40 [8];
  vector<int,_std::allocator<int>_> b_dist;
  WeightMap weight_pmap;
  unsigned_long N;
  int i;
  int times_local;
  Graph *g_local;
  
  poVar3 = std::operator<<((ostream *)&std::cout,"[i] ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,times);
  poVar3 = std::operator<<(poVar3," time(s)");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  __n = boost::
        num_vertices<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>::config,boost::directed_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>::config>>
                  ((adj_list_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config,_boost::directed_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config>_>
                    *)g);
  b_dist.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (pointer)boost::
                get<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>::config,boost::directed_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>::config>,int_EdgeProperties::*>
                          (0,(adj_list_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config,_boost::directed_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config>_>
                              *)g);
  sVar2 = std::numeric_limits<short>::max();
  local_44 = (int)sVar2;
  std::allocator<int>::allocator(&local_45);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_40,__n,&local_44,&local_45);
  std::allocator<int>::~allocator(&local_45);
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)((long)&begin + 7));
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_70,__n,
             (allocator<unsigned_long> *)((long)&begin + 7));
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)((long)&begin + 7));
  i_1 = clock();
  for (N._0_4_ = 0; weight_pmap.tag._0_4_ = (int)__n, (int)N < times; N._0_4_ = (int)N + 1) {
    for (sStack_88 = 0; sVar1 = sStack_88, sStack_88 < __n; sStack_88 = sStack_88 + 1) {
      pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_70,
                          sStack_88);
      *pvVar4 = sVar1;
    }
    if (times == 1) {
      local_134 = 0;
    }
    else {
      local_134 = randomRange(0,(int)weight_pmap.tag);
    }
    local_8c = local_134;
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_40,(long)local_134);
    *pvVar5 = 0;
    local_98 = b_dist.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_end_of_storage;
    pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_70,0);
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_40,0);
    boost::closed_plus<int>::closed_plus((closed_plus<int> *)((long)&end + 4));
    boost::bellman_visitor<boost::null_visitor>::bellman_visitor
              ((bellman_visitor<boost::null_visitor> *)((long)&end + 2));
    begin._6_1_ = boost::
                  bellman_ford_shortest_paths<boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>,int,boost::adj_list_edge_property_map<boost::directed_tag,int,int&,unsigned_long,EdgeProperties,int_EdgeProperties::*>,unsigned_long*,int*,boost::closed_plus<int>,std::less<int>,boost::bellman_visitor<boost::null_visitor>>
                            (g,__n & 0xffffffff,local_98,pvVar4,pvVar5,end._4_4_);
    if (!(bool)begin._6_1_) break;
  }
  cVar6 = clock();
  pred.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)(((double)(long)(cVar6 - i_1) / 1000000.0) / (double)((int)N + 1));
  poVar3 = std::operator<<((ostream *)&std::cout,"      Average time boost: ");
  poVar3 = (ostream *)
           std::ostream::operator<<
                     (poVar3,(double)pred.
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::operator<<(poVar3," seconds");
  if ((begin._6_1_ & 1) == 0) {
    poVar3 = std::operator<<((ostream *)&std::cout," (negative cycle)");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  else {
    std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  }
  this = (allocator<unsigned_long> *)
         ((long)&dist.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<unsigned_long>::allocator(this);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_c8,__n,this);
  std::allocator<unsigned_long>::~allocator
            ((allocator<unsigned_long> *)
             ((long)&dist.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  sVar2 = std::numeric_limits<short>::max();
  _s_1 = (long)sVar2;
  std::allocator<long>::allocator((allocator<long> *)((long)&elapsed_secs_rafa + 7));
  std::vector<long,_std::allocator<long>_>::vector
            ((vector<long,_std::allocator<long>_> *)local_e8,__n,(value_type_conflict1 *)&s_1,
             (allocator<long> *)((long)&elapsed_secs_rafa + 7));
  std::allocator<long>::~allocator((allocator<long> *)((long)&elapsed_secs_rafa + 7));
  i_1 = clock();
  for (N._0_4_ = 0; (int)N < times; N._0_4_ = (int)N + 1) {
    if (times == 1) {
      local_19c = 0;
    }
    else {
      local_19c = randomRange(0,(int)weight_pmap.tag);
    }
    elapsed_secs_rafa._0_4_ = local_19c;
    elapsed_secs_rafa._6_1_ =
         bellmanFord(g,(int *)&elapsed_secs_rafa,
                     (WeightMap *)
                     &b_dist.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,
                     (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_c8,
                     (vector<long,_std::allocator<long>_> *)local_e8);
  }
  cVar6 = clock();
  lVar7 = cVar6 - i_1;
  poVar3 = std::operator<<((ostream *)&std::cout,"      Average time rafa: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,((double)lVar7 / 1000000.0) / (double)times);
  std::operator<<(poVar3," seconds");
  if ((elapsed_secs_rafa._6_1_ & 1) == 0) {
    poVar3 = std::operator<<((ostream *)&std::cout," (negative cycle)");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  else {
    std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  }
  std::vector<long,_std::allocator<long>_>::~vector((vector<long,_std::allocator<long>_> *)local_e8)
  ;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_c8);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_70);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_40);
  return;
}

Assistant:

void benchmark(Graph g, int times)
{
    std::cout << "[i] " << times << " time(s)" << std::endl;
    int i;
    // setup
    unsigned long  N = num_vertices(g);

    // **************************************************** BOOST
    // init
    WeightMap weight_pmap = get(&EdgeProperties::weight, g);
    std::vector<int> b_dist(N, (std::numeric_limits < short >::max)());
    std::vector<std::size_t> b_pred(N);
    // run
    bool r_boost;
    clock_t begin = clock();
    for(i = 0; i<times ; ++i){
        for (unsigned long i = 0; i < N; ++i) b_pred[i] = i;
        int s = (times == 1) ? 0 : randomRange(0, (int)N);
        b_dist[s] = 0;
        r_boost = boost::bellman_ford_shortest_paths(
            g, int(N), weight_pmap, 
            &b_pred[0], &b_dist[0], 
            boost::closed_plus<int>(),
            std::less<int>(), 
            boost::default_bellman_visitor());
        if(!r_boost) break;
    }    
    clock_t end = clock();
    double elapsed_secs_boost = double(end-begin) / CLOCKS_PER_SEC / (i+1);
    // Info
    std::cout << "      Average time boost: " << elapsed_secs_boost << " seconds";
    if(!r_boost) std::cout << " (negative cycle)" << std::endl;
    else std::cout << std::endl;


    // **************************************************** RAFA
    // init
    std::vector<unsigned long> pred(N);
    std::vector<long> dist(N, (std::numeric_limits < short >::max)());
    // run
    begin = clock();
    bool r_rafa;
    for(i = 0; i<times ; ++i) {
        int s = (times == 1) ? 0 : randomRange(0, (int)N);
        r_rafa = bellmanFord(g, s, weight_pmap, pred, dist);
    }
    end = clock();
    double elapsed_secs_rafa = double(end - begin) / CLOCKS_PER_SEC / times;
    // Info
    std::cout << "      Average time rafa: " << elapsed_secs_rafa << " seconds";
    if(!r_rafa) std::cout << " (negative cycle)" << std::endl;
    else std::cout << std::endl;
}